

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O0

Url * __thiscall
Vault::Client::getUrl(Url *__return_storage_ptr__,Client *this,string *base,Path *path)

{
  char *string;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  Path *local_28;
  Path *path_local;
  string *base_local;
  Client *this_local;
  
  string = "http://";
  if ((this->tls_ & 1U) != 0) {
    string = "https://";
  }
  local_28 = path;
  path_local = (Path *)base;
  base_local = (string *)this;
  this_local = (Client *)__return_storage_ptr__;
  Vault::operator+(&local_c8,string,&this->host_);
  std::operator+(&local_a8,&local_c8,":");
  Vault::operator+(&local_88,&local_a8,&this->port_);
  std::operator+(&local_68,&local_88,&path_local->value_);
  Vault::operator+(&local_48,&local_68,local_28);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Client::getUrl(const std::string &base,
                                 const Vault::Path &path) const {
  return Vault::Url{(tls_ ? "https://" : "http://") + host_ + ":" + port_ +
                    base + path};
}